

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_DelRegistrar_Test::~PersistentStorageJsonTestSuite_DelRegistrar_Test
          (PersistentStorageJsonTestSuite_DelRegistrar_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, DelRegistrar)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    EXPECT_TRUE(psj.Del(RegistrarId(0)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(RegistrarId(1)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(RegistrarId(2)) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Del(RegistrarId(50)) == PersistentStorage::Status::kSuccess);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}